

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::root(Path *__return_storage_ptr__,Path *this)

{
  allocator local_39;
  string local_38 [32];
  Path *local_18;
  Path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/",&local_39);
  Path(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

Path Path::root() const
{
#if defined(_PATHIE_UNIX)
  return Path("/");
#elif defined(_WIN32)
  // Check if we have an absolute path with drive,
  // otherwise return the root for the current drive.
  if (m_path[1] == ':') // Colon is on Windows only allowed here to denote a preceeding drive letter => absolute path
    return Path(m_path.substr(0, 3));
  else
    return Path("/");
#else
#error Unsupported system.
#endif
}